

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O3

void __thiscall
unodb::test::
tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
assert_shrinking_inodes
          (tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this,inode_type_counter_array *expected_shrinking_inode_counts)

{
  size_type i;
  long lVar1;
  char *message;
  unsigned_long local_88;
  non_atomic_array<const_std::array<std::atomic<unsigned_long>,_4UL>_> actual_shrinking_inode_counts
  ;
  long local_58;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_50;
  char local_38 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_28;
  
  lVar1 = 0;
  do {
    actual_shrinking_inode_counts._M_elems[lVar1 + -1] =
         (this->test_db).shrinking_inode_counts._M_elems[lVar1].super___atomic_base<unsigned_long>.
         _M_i;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  std::vector<unsigned_long,std::allocator<unsigned_long>>::vector<unsigned_long_const*,void>
            ((vector<unsigned_long,std::allocator<unsigned_long>> *)
             (actual_shrinking_inode_counts._M_elems + 3),expected_shrinking_inode_counts->_M_elems,
             expected_shrinking_inode_counts[1]._M_elems,(allocator_type *)&local_28);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_28,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             (actual_shrinking_inode_counts._M_elems + 3));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_50,&local_28);
  if (local_28.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_28.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<unsigned_long>>::
  operator()(local_38,(char *)&local_50,
             (array<unsigned_long,_4UL> *)"(actual_shrinking_inode_counts)");
  if (local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (actual_shrinking_inode_counts._M_elems[3] != 0) {
    operator_delete((void *)actual_shrinking_inode_counts._M_elems[3],
                    local_58 - actual_shrinking_inode_counts._M_elems[3]);
  }
  if (local_38[0] == '\0') {
    testing::Message::Message((Message *)&local_28);
    if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
               ,0x2d1,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
    if (local_28.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_28.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  return;
}

Assistant:

constexpr void assert_shrinking_inodes(
      const inode_type_counter_array &expected_shrinking_inode_counts) {
    const auto actual_shrinking_inode_counts =
        test_db.get_shrinking_inode_counts();
    UNODB_ASSERT_THAT(
        actual_shrinking_inode_counts,
        ::testing::ElementsAreArray(expected_shrinking_inode_counts));
  }